

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O3

void poly1305_first_block(poly1305_state_internal *st,uint8_t *m)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  bool bVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  poly1305_state_internal *ppVar31;
  bool bVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 aVar36;
  anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 aVar37;
  anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 aVar38;
  anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 aVar39;
  ulong uVar40;
  anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 aVar41;
  ulong uVar42;
  
  ppVar31 = (poly1305_state_internal *)(st->P + 1);
  uVar1 = st->P[1].R20.d[1];
  uVar2 = st->P[1].R20.d[3];
  uVar30 = CONCAT44(uVar2,uVar1);
  uVar3 = st->P[1].R21.d[3];
  uVar4 = st->P[1].R21.d[1];
  uVar33 = CONCAT44(uVar3,uVar4);
  uVar5 = st->P[1].R22.d[3];
  uVar6 = st->P[1].R22.d[1];
  uVar35 = CONCAT44(uVar5,uVar6);
  uVar7 = st->P[1].R23.d[3];
  uVar8 = st->P[1].R23.d[1];
  uVar9 = st->P[1].R24.d[3];
  uVar10 = st->P[1].R24.d[1];
  bVar25 = true;
  do {
    bVar32 = bVar25;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar30;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar30;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar33 * 2;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar35 * 0x14;
    auVar11 = auVar12 * auVar18 + auVar11 * auVar17;
    uVar34 = auVar11._0_8_;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar35 * 0x14;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar35;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar30 * 2;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar33;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar33;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar33;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar30;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar35 * 2;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar11._8_8_ << 0x14 | uVar34 >> 0x2c;
    auVar23 = auVar14 * auVar20 + auVar13 * auVar19 + auVar23;
    uVar30 = auVar23._0_8_;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = auVar23._8_8_ << 0x14 | uVar30 >> 0x2c;
    auVar24 = auVar15 * auVar21 + auVar16 * auVar22 + auVar24;
    uVar35 = auVar24._0_8_ & 0x3ffffffffff;
    uVar34 = (auVar24._8_8_ << 0x16 | auVar24._0_8_ >> 0x2a) * 5 + (uVar34 & 0xfffffffffff);
    uVar33 = (uVar34 >> 0x2c) + (uVar30 & 0xfffffffffff);
    uVar30 = uVar34 & 0xfffffffffff;
    uVar26 = (uint)uVar34 & 0x3ffffff;
    aVar36.d[1] = 0;
    aVar36.d[0] = uVar26;
    aVar36.d[2] = uVar26;
    aVar36.d[3] = 0;
    ppVar31->P[0].R20 = aVar36;
    uVar26 = (uint)(uVar30 >> 0x1a) | ((uint)uVar33 & 0xff) << 0x12;
    aVar37._0_8_ = CONCAT44(0,uVar26);
    aVar37.d[2] = uVar26;
    aVar37.d[3] = 0;
    *(anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)ppVar31->P + 0x10) =
         aVar37;
    uVar27 = (uint)(uVar33 >> 8) & 0x3ffffff;
    aVar38._0_8_ = CONCAT44(0,uVar27);
    aVar38.d[2] = uVar27;
    aVar38.d[3] = 0;
    *(anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)ppVar31->P + 0x20) =
         aVar38;
    uVar28 = (uint)(uVar33 >> 0x22) | (auVar24._0_4_ & 0xffff) << 10;
    aVar39._0_8_ = CONCAT44(0,uVar28);
    aVar39.d[2] = uVar28;
    aVar39.d[3] = 0;
    *(anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)ppVar31->P + 0x30) =
         aVar39;
    uVar29 = (uint)(uVar35 >> 0x10);
    aVar41._0_8_ = CONCAT44(0,uVar29);
    aVar41.d[2] = uVar29;
    aVar41.d[3] = 0;
    *(anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)ppVar31->P + 0x40) =
         aVar41;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)ppVar31->P + 0x50))
    ->v[0] = aVar37._0_8_ * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)ppVar31->P + 0x58))
    ->v[0] = (ulong)uVar26 * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)ppVar31->P + 0x60))
    ->v[0] = aVar38._0_8_ * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)ppVar31->P + 0x68))
    ->v[0] = (ulong)uVar27 * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)ppVar31->P + 0x70))
    ->v[0] = aVar39._0_8_ * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)ppVar31->P + 0x78))
    ->v[0] = (ulong)uVar28 * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)ppVar31->P + 0x80))
    ->v[0] = aVar41._0_8_ * 5;
    ((anon_union_16_3_4e90a5c5_for_R20_R21_R22_R23_R24_S21_S22_S23_S24 *)((long)ppVar31->P + 0x88))
    ->v[0] = (ulong)uVar29 * 5;
    ppVar31 = (poly1305_state_internal *)((long)(ppVar31 + 0xffffffffffffffff) + 0x130);
    bVar25 = false;
  } while (bVar32);
  st->P[1].R20.d[1] = uVar1;
  st->P[1].R20.d[3] = uVar2;
  st->P[1].R21.d[1] = uVar4;
  st->P[1].R21.d[3] = uVar3;
  st->P[1].R22.d[1] = uVar6;
  st->P[1].R22.d[3] = uVar5;
  st->P[1].R23.d[1] = uVar8;
  st->P[1].R23.d[3] = uVar7;
  st->P[1].R24.d[1] = uVar10;
  st->P[1].R24.d[3] = uVar9;
  uVar30 = *(ulong *)(m + 0x10);
  uVar33 = *(ulong *)m;
  uVar35 = *(ulong *)(m + 0x18);
  uVar34 = *(ulong *)(m + 8);
  (st->field_1).HH[0] = uVar33 & 0x3ffffff;
  (st->field_1).HH[1] = uVar30 & 0x3ffffff;
  (st->field_1).HH[2] = uVar33 >> 0x1a & 0x3ffffff;
  (st->field_1).HH[3] = uVar30 >> 0x1a & 0x3ffffff;
  uVar40 = uVar34 << 0xc;
  uVar42 = uVar35 << 0xc;
  (st->field_1).HH[4] = uVar40 & 0x3ffffff | uVar33 >> 0x34;
  (st->field_1).HH[5] = uVar42 & 0x3ffffff | uVar30 >> 0x34;
  (st->field_1).HH[6] = uVar40 >> 0x1a & 0x3ffffff;
  (st->field_1).HH[7] = uVar42 >> 0x1a & 0x3ffffff;
  (st->field_1).HH[8] = uVar34 >> 0x28 | 0x1000000;
  (st->field_1).HH[9] = uVar35 >> 0x28 | 0x1000000;
  return;
}

Assistant:

static void poly1305_first_block(poly1305_state_internal *st,
                                 const uint8_t *m) {
  const xmmi MMASK =
      _mm_load_si128((const xmmi *)poly1305_x64_sse2_message_mask);
  const xmmi FIVE = _mm_load_si128((const xmmi *)poly1305_x64_sse2_5);
  const xmmi HIBIT = _mm_load_si128((const xmmi *)poly1305_x64_sse2_1shl128);
  xmmi T5, T6;
  poly1305_power *p;
  uint128_t d[3];
  uint64_t r0, r1, r2;
  uint64_t r20, r21, r22, s22;
  uint64_t pad0, pad1;
  uint64_t c;
  uint64_t i;

  // pull out stored info
  p = &st->P[1];

  r0 = ((uint64_t)p->R20.d[3] << 32) | (uint64_t)p->R20.d[1];
  r1 = ((uint64_t)p->R21.d[3] << 32) | (uint64_t)p->R21.d[1];
  r2 = ((uint64_t)p->R22.d[3] << 32) | (uint64_t)p->R22.d[1];
  pad0 = ((uint64_t)p->R23.d[3] << 32) | (uint64_t)p->R23.d[1];
  pad1 = ((uint64_t)p->R24.d[3] << 32) | (uint64_t)p->R24.d[1];

  // compute powers r^2,r^4
  r20 = r0;
  r21 = r1;
  r22 = r2;
  for (i = 0; i < 2; i++) {
    s22 = r22 * (5 << 2);

    d[0] = add128(mul64x64_128(r20, r20), mul64x64_128(r21 * 2, s22));
    d[1] = add128(mul64x64_128(r22, s22), mul64x64_128(r20 * 2, r21));
    d[2] = add128(mul64x64_128(r21, r21), mul64x64_128(r22 * 2, r20));

    r20 = lo128(d[0]) & 0xfffffffffff;
    c = shr128(d[0], 44);
    d[1] = add128_64(d[1], c);
    r21 = lo128(d[1]) & 0xfffffffffff;
    c = shr128(d[1], 44);
    d[2] = add128_64(d[2], c);
    r22 = lo128(d[2]) & 0x3ffffffffff;
    c = shr128(d[2], 42);
    r20 += c * 5;
    c = (r20 >> 44);
    r20 = r20 & 0xfffffffffff;
    r21 += c;

    p->R20.v = _mm_shuffle_epi32(_mm_cvtsi32_si128((uint32_t)(r20) & 0x3ffffff),
                                 _MM_SHUFFLE(1, 0, 1, 0));
    p->R21.v = _mm_shuffle_epi32(
        _mm_cvtsi32_si128((uint32_t)((r20 >> 26) | (r21 << 18)) & 0x3ffffff),
        _MM_SHUFFLE(1, 0, 1, 0));
    p->R22.v =
        _mm_shuffle_epi32(_mm_cvtsi32_si128((uint32_t)((r21 >> 8)) & 0x3ffffff),
                          _MM_SHUFFLE(1, 0, 1, 0));
    p->R23.v = _mm_shuffle_epi32(
        _mm_cvtsi32_si128((uint32_t)((r21 >> 34) | (r22 << 10)) & 0x3ffffff),
        _MM_SHUFFLE(1, 0, 1, 0));
    p->R24.v = _mm_shuffle_epi32(_mm_cvtsi32_si128((uint32_t)((r22 >> 16))),
                                 _MM_SHUFFLE(1, 0, 1, 0));
    p->S21.v = _mm_mul_epu32(p->R21.v, FIVE);
    p->S22.v = _mm_mul_epu32(p->R22.v, FIVE);
    p->S23.v = _mm_mul_epu32(p->R23.v, FIVE);
    p->S24.v = _mm_mul_epu32(p->R24.v, FIVE);
    p--;
  }

  // put saved info back
  p = &st->P[1];
  p->R20.d[1] = (uint32_t)(r0);
  p->R20.d[3] = (uint32_t)(r0 >> 32);
  p->R21.d[1] = (uint32_t)(r1);
  p->R21.d[3] = (uint32_t)(r1 >> 32);
  p->R22.d[1] = (uint32_t)(r2);
  p->R22.d[3] = (uint32_t)(r2 >> 32);
  p->R23.d[1] = (uint32_t)(pad0);
  p->R23.d[3] = (uint32_t)(pad0 >> 32);
  p->R24.d[1] = (uint32_t)(pad1);
  p->R24.d[3] = (uint32_t)(pad1 >> 32);

  // H = [Mx,My]
  T5 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 0)),
                          _mm_loadl_epi64((const xmmi *)(m + 16)));
  T6 = _mm_unpacklo_epi64(_mm_loadl_epi64((const xmmi *)(m + 8)),
                          _mm_loadl_epi64((const xmmi *)(m + 24)));
  st->H[0] = _mm_and_si128(MMASK, T5);
  st->H[1] = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
  T5 = _mm_or_si128(_mm_srli_epi64(T5, 52), _mm_slli_epi64(T6, 12));
  st->H[2] = _mm_and_si128(MMASK, T5);
  st->H[3] = _mm_and_si128(MMASK, _mm_srli_epi64(T5, 26));
  st->H[4] = _mm_or_si128(_mm_srli_epi64(T6, 40), HIBIT);
}